

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O0

void nsvg__duplicatePoints(NSVGrasterizer *r)

{
  NSVGpoint *pNVar1;
  NSVGrasterizer *r_local;
  
  if (r->cpoints2 < r->npoints) {
    r->cpoints2 = r->npoints;
    pNVar1 = (NSVGpoint *)realloc(r->points2,(long)r->cpoints2 << 5);
    r->points2 = pNVar1;
    if (r->points2 == (NSVGpoint *)0x0) {
      return;
    }
  }
  memcpy(r->points2,r->points,(long)r->npoints << 5);
  r->npoints2 = r->npoints;
  return;
}

Assistant:

static void nsvg__duplicatePoints(NSVGrasterizer* r)
{
	if (r->npoints > r->cpoints2) {
		r->cpoints2 = r->npoints;
		r->points2 = (NSVGpoint*)realloc(r->points2, sizeof(NSVGpoint) * r->cpoints2);
		if (r->points2 == NULL) return;
	}

	memcpy(r->points2, r->points, sizeof(NSVGpoint) * r->npoints);
	r->npoints2 = r->npoints;
}